

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O1

uintb __thiscall MemoryBank::getValue(MemoryBank *this,uintb offset,int4 size)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  
  iVar1 = this->wordsize;
  uVar7 = (uint)offset & iVar1 - 1U;
  iVar5 = iVar1 - uVar7;
  iVar3 = iVar5 - size;
  if (iVar5 < size) {
    iVar4 = size - iVar5;
    iVar3 = (*this->_vptr_MemoryBank[1])(this,(long)-iVar1 & offset);
    uVar6 = CONCAT44(extraout_var,iVar3);
    iVar1 = (*this->_vptr_MemoryBank[1])(this,(long)this->wordsize + ((long)-iVar1 & offset));
    uVar2 = CONCAT44(extraout_var_00,iVar1);
    iVar3 = this->wordsize - iVar4;
  }
  else {
    iVar1 = (*this->_vptr_MemoryBank[1])(this);
    uVar6 = CONCAT44(extraout_var_01,iVar1);
    if (this->wordsize == size) {
      return uVar6;
    }
    iVar4 = 0;
    uVar2 = 0;
    iVar5 = size;
  }
  if ((this->space->flags & 1) == 0) {
    uVar6 = uVar6 >> ((byte)(uVar7 << 3) & 0x3f);
    if (iVar4 == 0) goto LAB_00309aeb;
    uVar2 = uVar2 << ((byte)(iVar5 << 3) & 0x3f);
  }
  else {
    if (iVar4 == 0) {
      uVar6 = uVar6 >> ((byte)(iVar3 << 3) & 0x3f);
      goto LAB_00309aeb;
    }
    uVar6 = uVar6 << ((byte)(iVar4 << 3) & 0x3f);
    uVar2 = uVar2 >> ((byte)(iVar3 << 3) & 0x3f);
  }
  uVar6 = uVar6 | uVar2;
LAB_00309aeb:
  iVar1 = 8;
  if (size < 8) {
    iVar1 = size;
  }
  return uVar6 & uintbmasks[iVar1];
}

Assistant:

uintb MemoryBank::getValue(uintb offset,int4 size) const

{
  uintb res;
 
  uintb alignmask = (uintb) (wordsize-1);
  uintb ind = offset & (~alignmask);
  int4 skip = offset & alignmask;
  int4 size1 = wordsize-skip;
  int4 size2;
  int4 gap;
  uintb val1,val2;
  if (size > size1) {		// We have spill over
    size2 = size - size1;
    val1 = find(ind);
    val2 = find(ind+wordsize);
    gap = wordsize - size2;
  }
  else {
    val1 = find(ind);
    val2 = 0;
    if (size == wordsize)
      return val1;
    gap = size1-size;
    size1 = size;
    size2 = 0;
  }

  if (space->isBigEndian()) {
    if (size2 == 0)
      res = val1>>(8*gap);
    else
      res = (val1<<(8*size2)) | (val2 >> (8*gap));
  }
  else {
    if (size2 == 0)
      res = val1 >> (skip*8);
    else
      res = (val1>>(skip*8)) | (val2<<(size1*8) );
  }
  res &= (uintb)calc_mask(size);
  return res;
}